

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.cpp
# Opt level: O3

void __thiscall ocmesh::details::obj::cube(obj *this,voxel v)

{
  iterator __position;
  uint6 uVar1;
  u16vec3 uVar2;
  pointer ptVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  unsigned_long local_80;
  undefined8 local_78;
  float local_70;
  undefined8 local_6c;
  float local_64;
  undefined8 local_60;
  float local_58;
  undefined8 local_54;
  float local_4c;
  undefined8 local_48;
  float local_40;
  undefined8 local_3c;
  float local_34;
  undefined8 local_30;
  float local_28;
  undefined8 local_24;
  float local_1c;
  voxel local_18;
  
  local_18._code = v._code;
  uVar2 = voxel::coordinates(&local_18);
  local_70 = (float)uVar2.field_2;
  uVar1 = CONCAT24(uVar2.field_1.y,uVar2._0_4_) & 0xffff0000ffff;
  fVar5 = (float)(int)uVar1;
  fVar6 = (float)(ushort)(uVar1 >> 0x20);
  local_78 = CONCAT44(fVar6,fVar5);
  fVar7 = (float)(1 << (0xd - ((byte)((uint)local_18._code >> 0x15) & 0xf) & 0x1f) & 0xffff);
  local_6c = CONCAT44(fVar6,fVar5 + fVar7);
  fVar8 = fVar6 + fVar7;
  local_60 = CONCAT44(fVar8,fVar5);
  local_54 = CONCAT44(fVar8,fVar5 + fVar7);
  local_40 = local_70 + fVar7;
  local_3c = CONCAT44(fVar6,fVar5 + fVar7);
  local_30 = CONCAT44(fVar8,fVar5);
  local_24 = CONCAT44(fVar8,fVar5 + fVar7);
  ptVar3 = (this->_vertices).
           super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->_vertices).
                super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ptVar3;
  local_80 = (lVar4 >> 2) * -0x5555555555555555;
  __position._M_current =
       (this->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_64 = local_70;
  local_58 = local_70;
  local_4c = local_70;
  local_48 = local_78;
  local_34 = local_40;
  local_28 = local_40;
  local_1c = local_40;
  if (__position._M_current ==
      (this->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (&this->_indexes,__position,&local_80);
    ptVar3 = (this->_vertices).
             super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar4 = (long)(this->_vertices).
                  super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)ptVar3;
  }
  else {
    *__position._M_current = local_80;
    (this->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  std::
  vector<glm::tvec3<float,(glm::precision)0>,std::allocator<glm::tvec3<float,(glm::precision)0>>>::
  _M_range_insert<glm::tvec3<float,(glm::precision)0>*>
            ((vector<glm::tvec3<float,(glm::precision)0>,std::allocator<glm::tvec3<float,(glm::precision)0>>>
              *)this,(long)&ptVar3->field_0 + lVar4,&local_78,&local_18);
  return;
}

Assistant:

void cube(voxel v) {
            auto c = v.corners<glm::vec3>();
            
            _indexes.push_back(_vertices.size());
            
            _vertices.insert(_vertices.end(), begin(c), end(c));
        }